

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestCallTest::Run(TestCallTest *this)

{
  pointer *this_00;
  bool bVar1;
  pointer outputter;
  reference pvVar2;
  byte local_1701;
  RunParams local_16d8;
  allocator local_16b9;
  string local_16b8 [32];
  undefined1 local_1698 [8];
  Results rs;
  allocator local_1659;
  string local_1658 [32];
  undefined1 local_1638 [8];
  Test myTest;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> local_15f0;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> op;
  ostringstream local_15d8 [8];
  ostringstream oss;
  undefined1 local_1460 [8];
  TestRegistry r;
  TestCallTest *this_local;
  
  r._5192_8_ = this;
  testinator::TestRegistry::TestRegistry((TestRegistry *)local_1460);
  std::__cxx11::ostringstream::ostringstream(local_15d8);
  std::make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &myTest.m_op);
  std::unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>>::
  unique_ptr<testinator::DefaultOutputter,std::default_delete<testinator::DefaultOutputter>,void>
            ((unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>> *)
             &local_15f0,
             (unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
              *)&myTest.m_op);
  std::unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
  ::~unique_ptr((unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
                 *)&myTest.m_op);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1658,"call_test",&local_1659);
  this_00 = &rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)this_00);
  testinator::Test::Test
            ((Test *)local_1638,(TestRegistry *)local_1460,(string *)local_1658,(string *)this_00);
  std::__cxx11::string::~string
            ((string *)
             &rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_1658);
  std::allocator<char>::~allocator((allocator<char> *)&local_1659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16b8,"call_test",&local_16b9);
  local_16d8.m_flags = 0;
  local_16d8._4_4_ = 0;
  local_16d8.m_numPropertyChecks = 0;
  local_16d8.m_randomSeed = 0;
  testinator::RunParams::RunParams(&local_16d8);
  outputter = std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::
              get(&local_15f0);
  testinator::TestRegistry::RunTest
            ((Results *)local_1698,(TestRegistry *)local_1460,(string *)local_16b8,&local_16d8,
             outputter);
  std::__cxx11::string::~string(local_16b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16b9);
  bVar1 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::empty
                    ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1698);
  local_1701 = 0;
  if (!bVar1) {
    pvVar2 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::front
                       ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)
                        local_1698);
    local_1701 = pvVar2->m_success;
  }
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1698);
  testinator::Test::~Test((Test *)local_1638);
  std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::~unique_ptr
            (&local_15f0);
  std::__cxx11::ostringstream::~ostringstream(local_15d8);
  testinator::TestRegistry::~TestRegistry((TestRegistry *)local_1460);
  return (bool)(local_1701 & 1);
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);

    testinator::Test myTest(r, "call_test");
    testinator::Results rs = r.RunTest("call_test", testinator::RunParams(), op.get());
    return !rs.empty() && rs.front().m_success;
  }